

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O1

void __thiscall QAbstractSpinBox::wheelEvent(QAbstractSpinBox *this,QWheelEvent *event)

{
  long lVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  
  lVar1 = *(long *)(this + 8);
  iVar4 = *(int *)(lVar1 + 0x3ac) + *(int *)(event + 0x5c);
  *(int *)(lVar1 + 0x3ac) = iVar4 % 0x78;
  bVar3 = (**(code **)(*(long *)this + 0x1c8))();
  if ((bVar3 & (iVar4 < 0x78) + 1U) != 0) {
    iVar2 = (iVar4 / 0x78) * 10;
    if ((*(uint *)(event + 0x20) & *(uint *)(lVar1 + 0x3b4)) == 0) {
      iVar2 = iVar4 / 0x78;
    }
    (**(code **)(*(long *)this + 0x1b0))(this,iVar2);
  }
  event[0xc] = (QWheelEvent)0x1;
  return;
}

Assistant:

void QAbstractSpinBox::wheelEvent(QWheelEvent *event)
{
    Q_D(QAbstractSpinBox);
#ifdef Q_OS_MACOS
    // If the event comes from a real mouse wheel, rather than a track pad
    // (Qt::MouseEventSynthesizedBySystem), the shift modifier changes the
    // scroll orientation to horizontal.
    // Convert horizontal events back to vertical whilst shift is held.
    if ((event->modifiers() & Qt::ShiftModifier)
            && event->source() == Qt::MouseEventNotSynthesized) {
        d->wheelDeltaRemainder += event->angleDelta().x();
    } else {
        d->wheelDeltaRemainder += event->angleDelta().y();
    }
#else
    d->wheelDeltaRemainder += event->angleDelta().y();
#endif
    const int steps = d->wheelDeltaRemainder / 120;
    d->wheelDeltaRemainder -= steps * 120;
    if (stepEnabled() & (steps > 0 ? StepUpEnabled : StepDownEnabled))
        stepBy(event->modifiers() & d->stepModifier ? steps * 10 : steps);
    event->accept();
}